

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void FindRulePrecedences(lemon *xp)

{
  symbol *psVar1;
  bool bVar2;
  symbol *sp;
  int j;
  int i;
  rule *rp;
  lemon *xp_local;
  
  _j = xp->rule;
  do {
    if (_j == (rule *)0x0) {
      return;
    }
    if (_j->precsym == (symbol *)0x0) {
      sp._4_4_ = 0;
      while( true ) {
        bVar2 = false;
        if (sp._4_4_ < _j->nrhs) {
          bVar2 = _j->precsym == (symbol *)0x0;
        }
        if (!bVar2) break;
        psVar1 = _j->rhs[sp._4_4_];
        if (psVar1->type == MULTITERMINAL) {
          for (sp._0_4_ = 0; (int)sp < psVar1->nsubsym; sp._0_4_ = (int)sp + 1) {
            if (-1 < psVar1->subsym[(int)sp]->prec) {
              _j->precsym = psVar1->subsym[(int)sp];
              break;
            }
          }
        }
        else if (-1 < psVar1->prec) {
          _j->precsym = _j->rhs[sp._4_4_];
        }
        sp._4_4_ = sp._4_4_ + 1;
      }
    }
    _j = _j->next;
  } while( true );
}

Assistant:

void FindRulePrecedences(struct lemon *xp)
{
  struct rule *rp;
  for(rp=xp->rule; rp; rp=rp->next){
    if( rp->precsym==0 ){
      int i, j;
      for(i=0; i<rp->nrhs && rp->precsym==0; i++){
        struct symbol *sp = rp->rhs[i];
        if( sp->type==MULTITERMINAL ){
          for(j=0; j<sp->nsubsym; j++){
            if( sp->subsym[j]->prec>=0 ){
              rp->precsym = sp->subsym[j];
              break;
            }
          }
        }else if( sp->prec>=0 ){
          rp->precsym = rp->rhs[i];
        }
      }
    }
  }
  return;
}